

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall
SQVM::FOREACH_OP(SQVM *this,SQObjectPtr *o1,SQObjectPtr *o2,SQObjectPtr *o3,SQObjectPtr *o4,
                SQInteger arg_2,int exitpos,int *jump)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQGeneratorState SVar3;
  SQObjectType SVar4;
  SQTable *pSVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  SQChar *pSVar9;
  SQMetaMethod mm;
  SQTable *pSVar10;
  char *s;
  SQObjectPtr closure;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  
  SVar2 = (o1->super_SQObject)._type;
  if ((int)SVar2 < 0x8004000) {
    if (SVar2 == OT_STRING) {
      lVar8 = SQString::Next((o1->super_SQObject)._unVal.pString,o4,o2,o3);
    }
    else {
      if (SVar2 != OT_ARRAY) {
        if (SVar2 != OT_GENERATOR) {
LAB_0012b2ea:
          pSVar9 = GetTypeName(o1);
          Raise_Error(this,"cannot iterate %s",pSVar9);
          return false;
        }
        SVar3 = ((o1->super_SQObject)._unVal.pGenerator)->_state;
        if (SVar3 == eSuspended) {
          pSVar10 = (SQTable *)0x0;
          if ((o4->super_SQObject)._type == OT_INTEGER) {
            pSVar10 = (SQTable *)
                      ((long)&(((o4->super_SQObject)._unVal.pTable)->super_SQDelegable).
                              super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted + 1);
          }
          if (((o2->super_SQObject)._type & 0x8000000) != 0) {
            pSVar1 = &(((o2->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                      super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 - 1;
            if (*pSVar1 == 0) {
              (*(((o2->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._vptr_SQRefCounted[2])();
            }
          }
          (o2->super_SQObject)._type = OT_INTEGER;
          (o2->super_SQObject)._unVal.pTable = pSVar10;
          if (((o4->super_SQObject)._type & 0x8000000) != 0) {
            pSVar1 = &(((o4->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                      super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 - 1;
            if (*pSVar1 == 0) {
              (*(((o4->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._vptr_SQRefCounted[2])();
            }
          }
          (o4->super_SQObject)._type = OT_INTEGER;
          (o4->super_SQObject)._unVal.pTable = pSVar10;
          SQGenerator::Resume((o1->super_SQObject)._unVal.pGenerator,this,o3);
          *jump = 0;
          return true;
        }
        if (SVar3 != eDead) goto LAB_0012b2ea;
        goto LAB_0012b384;
      }
      lVar8 = SQArray::Next((o1->super_SQObject)._unVal.pArray,o4,o2,o3);
    }
  }
  else {
    if (0xa00007f < (int)SVar2) {
      if ((SVar2 != OT_USERDATA) && (SVar2 != OT_INSTANCE)) goto LAB_0012b2ea;
      pSVar10 = (o1->super_SQObject)._unVal.pTable;
      if ((pSVar10->super_SQDelegable)._delegate == (SQTable *)0x0) {
        return false;
      }
      local_50.super_SQObject._type = OT_NULL;
      local_50.super_SQObject._unVal.pTable = (SQTable *)0x0;
      local_40.super_SQObject._type = OT_NULL;
      local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
      iVar7 = (*(pSVar10->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                _vptr_SQRefCounted[6])(pSVar10,this,9);
      if ((char)iVar7 == '\0') {
        s = "_nexti failed";
LAB_0012b3a0:
        bVar6 = false;
        Raise_Error(this,s);
      }
      else {
        Push(this,o1);
        Push(this,o4);
        bVar6 = CallMetaMethod(this,&local_40,mm,2,&local_50);
        if (!bVar6) {
          bVar6 = false;
          goto LAB_0012b431;
        }
        SVar2 = (o2->super_SQObject)._type;
        pSVar10 = (o2->super_SQObject)._unVal.pTable;
        (o2->super_SQObject)._unVal.pTable = (SQTable *)local_50.super_SQObject._unVal;
        (o2->super_SQObject)._type = local_50.super_SQObject._type;
        if ((local_50.super_SQObject._type >> 0x1b & 1) != 0) {
          pSVar1 = &((local_50.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        if ((SVar2 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar10->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar10->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
        SVar2 = (o4->super_SQObject)._type;
        pSVar10 = (o4->super_SQObject)._unVal.pTable;
        pSVar5 = (o2->super_SQObject)._unVal.pTable;
        (o4->super_SQObject)._unVal.pTable = pSVar5;
        SVar4 = (o2->super_SQObject)._type;
        (o4->super_SQObject)._type = SVar4;
        if ((SVar4 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        if ((SVar2 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar10->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar10->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
        if (local_50.super_SQObject._type != OT_NULL) {
          bVar6 = Get(this,o1,&local_50,o3,0,0x29a);
          exitpos = 1;
          if (!bVar6) {
            s = "_nexti returned an invalid idx";
            goto LAB_0012b3a0;
          }
        }
        *jump = exitpos;
        bVar6 = true;
      }
LAB_0012b431:
      SQObjectPtr::~SQObjectPtr(&local_40);
      SQObjectPtr::~SQObjectPtr(&local_50);
      return bVar6;
    }
    if (SVar2 == OT_CLASS) {
      lVar8 = SQClass::Next((o1->super_SQObject)._unVal.pClass,o4,o2,o3);
    }
    else {
      if (SVar2 != OT_TABLE) goto LAB_0012b2ea;
      lVar8 = SQTable::Next((o1->super_SQObject)._unVal.pTable,false,o4,o2,o3);
    }
  }
  if (lVar8 != -1) {
    if (((o4->super_SQObject)._type & 0x8000000) != 0) {
      pSVar1 = &(((o4->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(((o4->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    (o4->super_SQObject)._type = OT_INTEGER;
    (o4->super_SQObject)._unVal.nInteger = lVar8;
    *jump = 1;
    return true;
  }
LAB_0012b384:
  *jump = exitpos;
  return true;
}

Assistant:

bool SQVM::FOREACH_OP(SQObjectPtr &o1,SQObjectPtr &o2,SQObjectPtr
&o3,SQObjectPtr &o4,SQInteger SQ_UNUSED_ARG(arg_2),int exitpos,int &jump)
{
    SQInteger nrefidx;
    switch(type(o1)) {
    case OT_TABLE:
        if((nrefidx = _table(o1)->Next(false,o4, o2, o3)) == -1) _FINISH(exitpos);
        o4 = (SQInteger)nrefidx; _FINISH(1);
    case OT_ARRAY:
        if((nrefidx = _array(o1)->Next(o4, o2, o3)) == -1) _FINISH(exitpos);
        o4 = (SQInteger) nrefidx; _FINISH(1);
    case OT_STRING:
        if((nrefidx = _string(o1)->Next(o4, o2, o3)) == -1)_FINISH(exitpos);
        o4 = (SQInteger)nrefidx; _FINISH(1);
    case OT_CLASS:
        if((nrefidx = _class(o1)->Next(o4, o2, o3)) == -1)_FINISH(exitpos);
        o4 = (SQInteger)nrefidx; _FINISH(1);
    case OT_USERDATA:
    case OT_INSTANCE:
        if(_delegable(o1)->_delegate) {
            SQObjectPtr itr;
            SQObjectPtr closure;
            if(_delegable(o1)->GetMetaMethod(this, MT_NEXTI, closure)) {
                Push(o1);
                Push(o4);
                if(CallMetaMethod(closure, MT_NEXTI, 2, itr)) {
                    o4 = o2 = itr;
                    if(type(itr) == OT_NULL) _FINISH(exitpos);
                    if(!Get(o1, itr, o3, 0, DONT_FALL_BACK)) {
                        Raise_Error(_SC("_nexti returned an invalid idx")); // cloud be changed
                        return false;
                    }
                    _FINISH(1);
                }
                else {
                    return false;
                }
            }
            Raise_Error(_SC("_nexti failed"));
            return false;
        }
        break;
    case OT_GENERATOR:
        if(_generator(o1)->_state == SQGenerator::eDead) _FINISH(exitpos);
        if(_generator(o1)->_state == SQGenerator::eSuspended) {
            SQInteger idx = 0;
            if(type(o4) == OT_INTEGER) {
                idx = _integer(o4) + 1;
            }
            o2 = idx;
            o4 = idx;
            _generator(o1)->Resume(this, o3);
            _FINISH(0);
        }
    default:
        Raise_Error(_SC("cannot iterate %s"), GetTypeName(o1));
    }
    return false; //cannot be hit(just to avoid warnings)
}